

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_KDF_SCHEME_Marshal(TPMU_KDF_SCHEME *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_KDF_SCHEME *source_local;
  
  switch(selector) {
  case 7:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)source,buffer,size);
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 0x10:
    source_local._6_2_ = 0;
    break;
  case 0x20:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)source,buffer,size);
    break;
  case 0x22:
    source_local._6_2_ = UINT16_Marshal((UINT16 *)source,buffer,size);
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_KDF_SCHEME_Marshal(TPMU_KDF_SCHEME *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_MGF1
        case TPM_ALG_MGF1:
            return TPMS_SCHEME_MGF1_Marshal((TPMS_SCHEME_MGF1 *)&(source->mgf1), buffer, size);
#endif // ALG_MGF1
#if         ALG_KDF1_SP800_56A
        case TPM_ALG_KDF1_SP800_56A:
            return TPMS_SCHEME_KDF1_SP800_56A_Marshal((TPMS_SCHEME_KDF1_SP800_56A *)&(source->kdf1_sp800_56a), buffer, size);
#endif // ALG_KDF1_SP800_56A
#if         ALG_KDF2
        case TPM_ALG_KDF2:
            return TPMS_SCHEME_KDF2_Marshal((TPMS_SCHEME_KDF2 *)&(source->kdf2), buffer, size);
#endif // ALG_KDF2
#if         ALG_KDF1_SP800_108
        case TPM_ALG_KDF1_SP800_108:
            return TPMS_SCHEME_KDF1_SP800_108_Marshal((TPMS_SCHEME_KDF1_SP800_108 *)&(source->kdf1_sp800_108), buffer, size);
#endif // ALG_KDF1_SP800_108
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}